

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O0

void __thiscall bloaty::Options::MergeFrom(Options *this,Message *from)

{
  Options *pOVar1;
  LogMessage *in_RSI;
  LogMessage *in_RDI;
  Options *in_stack_00000018;
  Options *source;
  Message *in_stack_000003c8;
  Message *in_stack_000003d0;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  LogMessage *this_00;
  undefined8 in_stack_ffffffffffffff88;
  LogMessage local_48;
  
  if (in_RSI == in_RDI) {
    this_00 = &local_48;
    google::protobuf::internal::LogMessage::LogMessage
              (in_RDI,(LogLevel_conflict)((ulong)in_stack_ffffffffffffff88 >> 0x20),(char *)this_00,
               in_stack_ffffffffffffff7c);
    google::protobuf::internal::LogMessage::operator<<
              (this_00,(char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    google::protobuf::internal::LogFinisher::operator=
              ((LogFinisher *)this_00,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)0x1bf085);
  }
  pOVar1 = google::protobuf::DynamicCastToGenerated<bloaty::Options>((Message *)in_RDI);
  if (pOVar1 == (Options *)0x0) {
    google::protobuf::internal::ReflectionOps::Merge(in_stack_000003d0,in_stack_000003c8);
  }
  else {
    MergeFrom(source,in_stack_00000018);
  }
  return;
}

Assistant:

void Options::MergeFrom(const ::PROTOBUF_NAMESPACE_ID::Message& from) {
// @@protoc_insertion_point(generalized_merge_from_start:bloaty.Options)
  GOOGLE_DCHECK_NE(&from, this);
  const Options* source =
      ::PROTOBUF_NAMESPACE_ID::DynamicCastToGenerated<Options>(
          &from);
  if (source == nullptr) {
  // @@protoc_insertion_point(generalized_merge_from_cast_fail:bloaty.Options)
    ::PROTOBUF_NAMESPACE_ID::internal::ReflectionOps::Merge(from, this);
  } else {
  // @@protoc_insertion_point(generalized_merge_from_cast_success:bloaty.Options)
    MergeFrom(*source);
  }
}